

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGGradientElement::collectGradientAttributes
          (SVGGradientElement *this,SVGGradientAttributes *attributes)

{
  bool bVar1;
  char cVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  if ((attributes->m_gradientTransform == (SVGGradientElement *)0x0) &&
     (bVar1 = SVGElement::hasAttribute((SVGElement *)this,GradientTransform), bVar1)) {
    attributes->m_gradientTransform = this;
  }
  if ((attributes->m_spreadMethod == (SVGGradientElement *)0x0) &&
     (bVar1 = SVGElement::hasAttribute((SVGElement *)this,SpreadMethod), bVar1)) {
    attributes->m_spreadMethod = this;
  }
  if ((attributes->m_gradientUnits == (SVGGradientElement *)0x0) &&
     (bVar1 = SVGElement::hasAttribute((SVGElement *)this,GradientUnits), bVar1)) {
    attributes->m_gradientUnits = this;
  }
  if (attributes->m_gradientContentElement == (SVGGradientElement *)0x0) {
    for (p_Var3 = (this->super_SVGPaintElement).super_SVGElement.m_children.
                  super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)&(this->super_SVGPaintElement).super_SVGElement.m_children;
        p_Var3 = p_Var3->_M_next) {
      p_Var4 = p_Var3[1]._M_next;
      if ((p_Var4 == (_List_node_base *)0x0) ||
         (cVar2 = (**(code **)((long)p_Var4->_M_next + 0x18))(p_Var4), cVar2 == '\0')) {
        p_Var4 = (_List_node_base *)0x0;
      }
      if ((p_Var4 != (_List_node_base *)0x0) && (*(char *)((long)(p_Var4 + 4) + 3) == '\x12')) {
        attributes->m_gradientContentElement = this;
        return;
      }
    }
  }
  return;
}

Assistant:

void SVGGradientElement::collectGradientAttributes(SVGGradientAttributes& attributes) const
{
    if(!attributes.hasGradientTransform() && hasAttribute(PropertyID::GradientTransform))
        attributes.setGradientTransform(this);
    if(!attributes.hasSpreadMethod() && hasAttribute(PropertyID::SpreadMethod))
        attributes.setSpreadMethod(this);
    if(!attributes.hasGradientUnits() && hasAttribute(PropertyID::GradientUnits))
        attributes.setGradientUnits(this);
    if(!attributes.hasGradientContentElement()) {
        for(const auto& child : children()) {
            if(auto element = toSVGElement(child); element && element->id() == ElementID::Stop) {
                attributes.setGradientContentElement(this);
                break;
            }
        }
    }
}